

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_mem.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  size_t sVar1;
  size_t sVar2;
  bool bVar3;
  TestUnit *newUnits;
  size_t poolCapacity;
  bool valid;
  TestUnit *units;
  MemoryPool pool;
  size_t in_stack_fffffffffffffe80;
  MemoryPool *in_stack_fffffffffffffe88;
  MemoryPool *in_stack_fffffffffffffe98;
  size_t in_stack_fffffffffffffea0;
  MemoryPool *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffee8;
  uint uVar4;
  undefined4 in_stack_fffffffffffffeec;
  MemoryPool local_100;
  uint local_54;
  
  local_54 = 0;
  phyr::MemoryPool::MemoryPool(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
  phyr::MemoryPool::alloc<_TestUnit>
            (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
             SUB81((ulong)in_stack_fffffffffffffe98 >> 0x38,0));
  sVar1 = phyr::MemoryPool::size(&local_100);
  sVar2 = phyr::MemoryPool::size(&local_100);
  bVar3 = (sVar1 & sVar2 - 1) == 0;
  uVar4 = CONCAT13(bVar3,(int3)in_stack_fffffffffffffee8);
  if (bVar3) {
    phyr::MemoryPool::reset(in_stack_fffffffffffffe98);
    sVar1 = phyr::MemoryPool::size(&local_100);
    in_stack_fffffffffffffea8 = (MemoryPool *)phyr::MemoryPool::size(&local_100);
    uVar4 = CONCAT13((sVar1 & (ulong)&in_stack_fffffffffffffea8[-1].field_0x7f) == 0,(int3)uVar4);
  }
  if ((char)(uVar4 >> 0x18) != '\0') {
    sVar1 = phyr::MemoryPool::size(&local_100);
    in_stack_fffffffffffffe98 =
         (MemoryPool *)
         phyr::MemoryPool::alloc<_TestUnit>
                   (in_stack_fffffffffffffea8,sVar1,
                    SUB81((ulong)in_stack_fffffffffffffe98 >> 0x38,0));
    sVar2 = phyr::MemoryPool::size(&local_100);
    uVar4 = CONCAT13(sVar1 == sVar2,(int3)uVar4);
  }
  phyr::MemoryPool::reset(in_stack_fffffffffffffe98);
  local_54 = (uint)((uVar4 & 0x1000000) == 0);
  phyr::MemoryPool::~MemoryPool((MemoryPool *)CONCAT44(in_stack_fffffffffffffeec,uVar4));
  return local_54;
}

Assistant:

int main(int argc, const char* argv[]) {
    MemoryPool pool;

    // Create an array of TestUnits
    TestUnit* units = pool.alloc<TestUnit>(100);
    // Pool size must be a power of 2
    bool valid = (pool.size() & (pool.size() - 1)) == 0;

    if (valid) {
        pool.reset();
        valid = (pool.size() & (pool.size() - 1)) == 0;
    }

    if (valid) {
        size_t poolCapacity = pool.size();
        TestUnit* newUnits = pool.alloc<TestUnit>(50);
        valid = poolCapacity == pool.size();
    }

    pool.reset();
    return valid ? 0 : 1;
}